

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O1

void __thiscall Game::Game(Game *this,vector<Player,_std::allocator<Player>_> *players)

{
  pointer piVar1;
  value_type_conflict2 *__val;
  pointer piVar2;
  
  std::vector<Player,_std::allocator<Player>_>::vector(&this->m_players,players);
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_allCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_allCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_allCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_playerCards).
  super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_playerCards).
  super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_playerCards).
  super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  Ruleset::Ruleset(&this->m_rules);
  initializeCards(this);
  piVar2 = (pointer)operator_new(0x10);
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar1 = (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = piVar2;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piVar2 + 4;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar2 + 4;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
    return;
  }
  return;
}

Assistant:

explicit Game(std::vector<Player> &players) : m_players(players) {
        initializeCards();
        m_playerPoints = std::vector<int>(4);
    }